

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O1

JSValue js_os_getcwd(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  char *pcVar1;
  int *piVar2;
  int err;
  JSValue JVar3;
  char buf [4096];
  char local_1018 [4104];
  
  pcVar1 = getcwd(local_1018,0x1000);
  err = 0;
  if (pcVar1 == (char *)0x0) {
    local_1018[0] = '\0';
    piVar2 = __errno_location();
    err = *piVar2;
  }
  JVar3 = JS_NewString(ctx,local_1018);
  JVar3 = make_obj_error(ctx,JVar3,err);
  return JVar3;
}

Assistant:

static JSValue js_os_getcwd(JSContext *ctx, JSValueConst this_val,
                            int argc, JSValueConst *argv)
{
    char buf[PATH_MAX];
    int err;
    
    if (!getcwd(buf, sizeof(buf))) {
        buf[0] = '\0';
        err = errno;
    } else {
        err = 0;
    }
    return make_string_error(ctx, buf, err);
}